

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

int cppcms_capi_session_save(cppcms_capi_session *session)

{
  session_interface *this;
  cppcms_capi_session *in_RDI;
  session_interface *in_stack_00000110;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
  local_28 [3];
  int local_4;
  
  if (in_RDI == (cppcms_capi_session *)0x0) {
    local_4 = -1;
  }
  else {
    cppcms_capi_session::check_loaded_unsaved(in_RDI);
    this = booster::hold_ptr<cppcms::session_interface>::operator->(&in_RDI->p);
    cppcms::session_interface::save(in_stack_00000110);
    in_RDI->saved = true;
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
                  *)this);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
    ::_Rb_tree_const_iterator(local_28,&local_30);
    (in_RDI->adapter).cookies_ptr._M_node = local_28[0]._M_node;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int cppcms_capi_session_save(cppcms_capi_session *session)
{
	TRY {
		if(!session)
			return -1;
		session->check_loaded_unsaved();
		session->p->save();
		session->saved = true;
		session->adapter.cookies_ptr=session->adapter.cookies.begin();
	}